

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.h
# Opt level: O2

bool glslang::TDefaultIoResolverBase::isUavType(TType *type)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar2 = (*type->_vptr_TType[0xb])();
  if ((*(byte *)(CONCAT44(extraout_var,iVar2) + 0xd) & 0x80) == 0) {
    iVar2 = (*type->_vptr_TType[7])(type);
    if (iVar2 == 0xe) {
      iVar2 = (*type->_vptr_TType[8])(type);
      bVar1 = TSampler::isImage((TSampler *)CONCAT44(extraout_var_00,iVar2));
      if (bVar1) {
        return true;
      }
    }
    iVar2 = (*type->_vptr_TType[0xb])(type);
    bVar1 = (*(uint *)(CONCAT44(extraout_var_01,iVar2) + 8) & 0x7f) == 6;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool isUavType(const glslang::TType& type) {
        if (type.getQualifier().isReadOnly())
            return false;
        return (type.getBasicType() == glslang::EbtSampler && type.getSampler().isImage()) ||
                (type.getQualifier().storage == EvqBuffer);
    }